

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::setDragMode(QGraphicsView *this,DragMode mode)

{
  QGraphicsViewPrivate *this_00;
  DragMode in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  QWidget *this_01;
  QCursor local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QGraphicsView *)0xa383be);
  if (this_00->dragMode != in_ESI) {
    QGraphicsViewPrivate::clearRubberBand
              ((QGraphicsViewPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
    if (this_00->dragMode == ScrollHandDrag) {
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RDI);
      QWidget::unsetCursor((QWidget *)this_00);
    }
    if (((this_00->dragMode == ScrollHandDrag) && (in_ESI == NoDrag)) &&
       ((*(uint *)&this_00->field_0x300 >> 9 & 1) != 0)) {
      *(uint *)&this_00->field_0x300 = *(uint *)&this_00->field_0x300 & 0xfffffdff;
    }
    this_00->dragMode = in_ESI;
    if (this_00->dragMode == ScrollHandDrag) {
      this_00->hasStoredOriginalCursor = false;
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RDI);
      QCursor::QCursor(&local_10,OpenHandCursor);
      QWidget::setCursor(this_01,(QCursor *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
      QCursor::~QCursor(&local_10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::setDragMode(DragMode mode)
{
    Q_D(QGraphicsView);
    if (d->dragMode == mode)
        return;

#if QT_CONFIG(rubberband)
    d->clearRubberBand();
#endif

#ifndef QT_NO_CURSOR
    if (d->dragMode == ScrollHandDrag)
        viewport()->unsetCursor();
#endif

    // If dragMode is unset while dragging, e.g. via a keyEvent, we
    // don't unset the handScrolling state. When enabling scrolling
    // again the mouseMoveEvent will automatically start scrolling,
    // without a mousePress
    if (d->dragMode == ScrollHandDrag && mode == NoDrag && d->handScrolling)
        d->handScrolling = false;

    d->dragMode = mode;

#ifndef QT_NO_CURSOR
    if (d->dragMode == ScrollHandDrag) {
        // Forget the stored viewport cursor when we enter scroll hand drag mode.
        d->hasStoredOriginalCursor = false;
        viewport()->setCursor(Qt::OpenHandCursor);
    }
#endif
}